

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
boost::
dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>,BayesianGameIdenticalPayoffSolver>
          (shared_ptr<BayesianGameIdenticalPayoffSolver> *r)

{
  element_type *this;
  shared_ptr<BayesianGameIdenticalPayoffSolver> *r_00;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar1;
  shared_ptr<BayesianGameIdenticalPayoffSolver> *in_RSI;
  element_type *in_RDI;
  shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> sVar2;
  E *p;
  
  this = shared_ptr<BayesianGameIdenticalPayoffSolver>::get(in_RSI);
  if (this == (element_type *)0x0) {
    r_00 = (shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x0;
  }
  else {
    r_00 = (shared_ptr<BayesianGameIdenticalPayoffSolver> *)
           __dynamic_cast(this,&BayesianGameIdenticalPayoffSolver::typeinfo,
                          &BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>::
                           typeinfo,0);
  }
  if (r_00 == (shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x0) {
    shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::shared_ptr
              ((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
                *)0x96f47f);
    sVar1.pi_ = extraout_RDX_00;
  }
  else {
    shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
    shared_ptr<BayesianGameIdenticalPayoffSolver>
              ((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
                *)this,r_00,(element_type *)0x96f473);
    sVar1.pi_ = extraout_RDX;
  }
  sVar2.pn.pi_ = sVar1.pi_;
  sVar2.px = in_RDI;
  return sVar2;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}